

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O1

SizeT ARM_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  uint uVar1;
  SizeT SVar2;
  int iVar3;
  int iVar4;
  
  if (size < 4) {
    return 0;
  }
  iVar3 = -8 - ip;
  SVar2 = 0;
  do {
    if (data[SVar2 + 3] == 0xeb) {
      iVar4 = ip + 8 + (int)SVar2;
      if (encoding == 0) {
        iVar4 = iVar3;
      }
      uVar1 = iVar4 + ((uint)data[SVar2] |
                      (uint)data[SVar2 + 1] << 8 | (uint)data[SVar2 + 2] << 0x10) * 4;
      data[SVar2 + 2] = (Byte)(uVar1 >> 0x12);
      data[SVar2 + 1] = (Byte)(uVar1 >> 10);
      data[SVar2] = (Byte)(uVar1 >> 2);
    }
    SVar2 = SVar2 + 4;
    iVar3 = iVar3 + -4;
  } while (SVar2 <= size - 4);
  return SVar2;
}

Assistant:

SizeT ARM_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 8;
  for (i = 0; i <= size; i += 4)
  {
    if (data[i + 3] == 0xEB)
    {
      UInt32 dest;
      UInt32 src = ((UInt32)data[i + 2] << 16) | ((UInt32)data[i + 1] << 8) | (data[i + 0]);
      src <<= 2;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 2;
      data[i + 2] = (Byte)(dest >> 16);
      data[i + 1] = (Byte)(dest >> 8);
      data[i + 0] = (Byte)dest;
    }
  }
  return i;
}